

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds-load.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  LoadBlock load_;
  bool bVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 uStack_1828;
  bool help;
  undefined1 local_1826 [2];
  allocator<char> local_1824;
  allocator<char> local_1823;
  allocator<char> local_1822;
  allocator<char> local_1821;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1820;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1818;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1810;
  _Invoker_type p_Stack_1808;
  environment env;
  int nvals;
  int tot_blocks;
  _Any_data local_17f8;
  code *local_17e8;
  code *local_17e0;
  communicator world;
  ContiguousAssigner read_assigner;
  code *local_17a0 [2];
  code *local_1790;
  code *local_1788;
  code *local_1780 [2];
  code *local_1770;
  code *local_1768;
  communicator local_1760;
  string local_1748;
  _Any_data local_1728;
  undefined8 local_1718;
  undefined8 uStack_1710;
  _Any_data local_1708;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  string local_16e0;
  string local_16c0;
  Options ops;
  code *local_1668 [2];
  code *local_1658;
  code *local_1650;
  Master read_master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  tot_blocks = world.size_;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  nvals = 100;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read_master,"tot_blocks",&local_1821);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_17f8._M_pod_data," total number of blocks",&local_1822);
  opts::Option<int>((opts *)&local_1810,'b',(string *)&read_master,&tot_blocks,(string *)&local_17f8
                   );
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1810);
  std::__cxx11::string::string<std::allocator<char>>((string *)&read_assigner,"nvals",&local_1823);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1748," number of values per block",&local_1824);
  opts::Option<int>((opts *)&local_1818,'n',(string *)&read_assigner,&nvals,&local_1748);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1818);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16c0,"help",(allocator<char> *)(local_1826 + 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16e0," show help",(allocator<char> *)local_1826);
  opts::Option<bool>((opts *)&local_1820,'h',&local_16c0,&help,&local_16e0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1820);
  if (local_1820._M_head_impl != (BasicOption *)0x0) {
    (*(local_1820._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1820._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_16e0);
  std::__cxx11::string::~string((string *)&local_16c0);
  if (local_1818._M_head_impl != (BasicOption *)0x0) {
    (*(local_1818._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1818._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1748);
  std::__cxx11::string::~string((string *)&read_assigner);
  if (local_1810._M_head_impl != (BasicOption *)0x0) {
    (*(local_1810._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1810._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)local_17f8._M_pod_data);
  std::__cxx11::string::~string((string *)&read_master);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    local_1760.comm_.data = world.comm_.data;
    local_1760.owner_ = false;
    local_1780[1] = (code *)0x0;
    local_1780[0] = Block::create;
    local_1768 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_17a0[1] = (code *)0x0;
    local_1770 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_17a0[0] = Block::destroy;
    local_1788 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_1790 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_1708._M_unused._M_object = (void *)0x0;
    local_1708._8_8_ = 0;
    local_16f8 = 0;
    uStack_16f0 = 0;
    local_1728._M_unused._M_object = (void *)0x0;
    local_1728._8_8_ = 0;
    local_1718 = 0;
    uStack_1710 = 0;
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = &PTR_unload_incoming_00140278;
    puVar2[1] = 0x1000;
    save.super__Function_base._M_functor._8_8_ = &local_1728;
    save.super__Function_base._M_functor._M_unused._M_object = &local_1708;
    save.super__Function_base._M_manager = (_Manager_type)puVar2;
    save._M_invoker._0_1_ = uStack_1828;
    save._M_invoker._1_1_ = help;
    save._M_invoker._2_6_ = _local_1826;
    load_.super__Function_base._M_functor._8_8_ = local_1818._M_head_impl;
    load_.super__Function_base._M_functor._M_unused._M_object = local_1820._M_head_impl;
    load_.super__Function_base._M_manager = (_Manager_type)local_1810._M_head_impl;
    load_._M_invoker = p_Stack_1808;
    diy::Master::Master(&read_master,&local_1760,1,-1,(CreateBlock *)local_1780,
                        (DestroyBlock *)local_17a0,(ExternalStorage *)0x0,save,load_,
                        (QueuePolicy *)CONCAT44(tot_blocks,nvals));
    std::_Function_base::~_Function_base((_Function_base *)&local_1728);
    std::_Function_base::~_Function_base((_Function_base *)&local_1708);
    std::_Function_base::~_Function_base((_Function_base *)local_17a0);
    std::_Function_base::~_Function_base((_Function_base *)local_1780);
    diy::mpi::communicator::~communicator(&local_1760);
    read_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    read_assigner.super_StaticAssigner.super_Assigner.nblocks_ = -1;
    read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_001403f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_17f8._M_pod_data,"test.out",(allocator<char> *)&local_1748);
    local_1668[1] = (code *)0x0;
    local_1668[0] = Block::load;
    local_1650 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1658 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    diy::io::read_blocks
              ((string *)&local_17f8,&world,&read_assigner.super_StaticAssigner,&read_master,
               (LoadBlock *)local_1668);
    std::_Function_base::~_Function_base((_Function_base *)local_1668);
    std::__cxx11::string::~string((string *)local_17f8._M_pod_data);
    local_17f8._0_4_ =
         (int)((ulong)((long)read_master.blocks_.elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)read_master.blocks_.elements_.
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    fmt::v7::print<char[26],unsigned_int,char>
              (_stderr,(char (*) [26])"{} blocks read from file\n",(uint *)local_17f8._M_pod_data);
    local_1748._M_dataplus._M_p = (pointer)Block::print_data;
    local_1748._M_string_length = 0;
    local_17f8._M_unused._M_object = (void *)0x0;
    local_17f8._8_8_ = 0;
    local_17e0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_17e8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&read_master,(offset_in_Block_to_subr *)&local_1748,(Skip *)&local_17f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_17f8);
    diy::Master::~Master(&read_master);
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // read the results back
    diy::Master read_master(world,
            num_threads,
            mem_blocks,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);
}